

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O0

Vec3<double> * Imath_2_5::rgb2hsv_d(Vec3<double> *c)

{
  double *pdVar1;
  double *pdVar2;
  double *in_RSI;
  Vec3<double> *in_RDI;
  double h;
  double hue;
  double sat;
  double val;
  double range;
  double min;
  double max;
  double *z;
  double *y;
  double *x;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_60;
  double local_58;
  double local_50;
  
  pdVar1 = in_RSI + 1;
  pdVar2 = in_RSI + 2;
  if (*in_RSI < *pdVar1 || *in_RSI == *pdVar1) {
    if (*pdVar1 < *pdVar2 || *pdVar1 == *pdVar2) {
      local_88 = *pdVar2;
    }
    else {
      local_88 = *pdVar1;
    }
    local_80 = local_88;
  }
  else {
    if (*in_RSI < *pdVar2 || *in_RSI == *pdVar2) {
      local_78 = *pdVar2;
    }
    else {
      local_78 = *in_RSI;
    }
    local_80 = local_78;
  }
  if (*pdVar1 <= *in_RSI) {
    if (*pdVar2 <= *pdVar1) {
      local_a0 = *pdVar2;
    }
    else {
      local_a0 = *pdVar1;
    }
    local_98 = local_a0;
  }
  else {
    if (*pdVar2 <= *in_RSI) {
      local_90 = *pdVar2;
    }
    else {
      local_90 = *in_RSI;
    }
    local_98 = local_90;
  }
  local_98 = local_80 - local_98;
  local_50 = 0.0;
  local_58 = 0.0;
  if ((local_80 != 0.0) || (NAN(local_80))) {
    local_50 = local_98 / local_80;
  }
  if ((local_50 != 0.0) || (NAN(local_50))) {
    if ((*in_RSI != local_80) || (NAN(*in_RSI) || NAN(local_80))) {
      if ((*pdVar1 != local_80) || (NAN(*pdVar1) || NAN(local_80))) {
        local_60 = (*in_RSI - *pdVar1) / local_98 + 4.0;
      }
      else {
        local_60 = (*pdVar2 - *in_RSI) / local_98 + 2.0;
      }
    }
    else {
      local_60 = (*pdVar1 - *pdVar2) / local_98;
    }
    local_58 = local_60 / 6.0;
    if (local_58 < 0.0) {
      local_58 = local_58 + 1.0;
    }
  }
  Vec3<double>::Vec3(in_RDI,local_58,local_50,local_80);
  return in_RDI;
}

Assistant:

Vec3<double>
rgb2hsv_d(const Vec3<double> &c)
{
    const double &x = c.x;
    const double &y = c.y;
    const double &z = c.z;

    double max	 = (x > y) ? ((x > z) ? x : z) : ((y > z) ? y : z);
    double min	 = (x < y) ? ((x < z) ? x : z) : ((y < z) ? y : z);
    double range = max - min;
    double val	 = max;
    double sat   = 0;
    double hue   = 0;
    
    if (max != 0)   sat = range/max;
    
    if (sat != 0) 
    {
	double h;
	
	if      (x == max)	h =     (y - z) / range;
	else if (y == max)	h = 2 + (z - x) / range;
	else		h = 4 + (x - y) / range;

	hue = h/6.;
	    
	if (hue < 0.)
	    hue += 1.0;
    }
    return Vec3<double>(hue,sat,val);
}